

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineBlendTests.cpp
# Opt level: O2

string * __thiscall
vkt::pipeline::getBlendStateSetName_abi_cxx11_
          (string *__return_storage_ptr__,pipeline *this,
          VkPipelineColorBlendAttachmentState *blendStates)

{
  VkPipelineColorBlendAttachmentState *extraout_RDX;
  VkPipelineColorBlendAttachmentState *extraout_RDX_00;
  VkPipelineColorBlendAttachmentState *extraout_RDX_01;
  VkPipelineColorBlendAttachmentState *blendState;
  long lVar1;
  ostringstream name;
  string sStack_1c8;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  blendState = extraout_RDX;
  for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 0x20) {
    getBlendStateName_abi_cxx11_(&sStack_1c8,this + lVar1,blendState);
    std::operator<<((ostream *)local_1a8,(string *)&sStack_1c8);
    std::__cxx11::string::~string((string *)&sStack_1c8);
    blendState = extraout_RDX_00;
    if (lVar1 != 0x60) {
      std::operator<<((ostream *)local_1a8,"-");
      blendState = extraout_RDX_01;
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string getBlendStateSetName (const VkPipelineColorBlendAttachmentState blendStates[BlendTest::QUAD_COUNT])
{
	std::ostringstream name;

	for (int quadNdx = 0; quadNdx < BlendTest::QUAD_COUNT; quadNdx++)
	{
		name << getBlendStateName(blendStates[quadNdx]);

		if (quadNdx < BlendTest::QUAD_COUNT - 1)
			name << "-";
	}

	return name.str();
}